

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O3

int ssl_buffer_make_space(mbedtls_ssl_context *ssl,size_t desired)

{
  mbedtls_ssl_handshake_params *pmVar1;
  char *format;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  pmVar1 = ssl->handshake;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x10d4,"Attempt to free buffered messages to have %u bytes available",
             desired & 0xffffffff);
  ssl_free_buffered_record((mbedtls_ssl_context *)ssl->handshake);
  if (0x8000 - (pmVar1->buffering).total_bytes_buffered < desired) {
    uVar4 = 3;
    do {
      iVar2 = (int)uVar4;
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x10e8,
                 "Free buffering slot %d to make space for reassembly of next handshake message",
                 uVar4);
      ssl_buffering_free_slot((mbedtls_ssl_context *)ssl->handshake,(uint8_t)uVar4);
      if (desired <= 0x8000 - (pmVar1->buffering).total_bytes_buffered) {
        format = "Enough space available after freeing buffered HS messages";
        iVar2 = 0x10ef;
        goto LAB_001ff515;
      }
      uVar4 = (ulong)(iVar2 - 1);
    } while (iVar2 != 0);
    iVar3 = -1;
  }
  else {
    format = "Enough space available after freeing future epoch record";
    iVar2 = 0x10dc;
LAB_001ff515:
    iVar3 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,iVar2,format);
  }
  return iVar3;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_buffer_make_space(mbedtls_ssl_context *ssl,
                                 size_t desired)
{
    int offset;
    mbedtls_ssl_handshake_params * const hs = ssl->handshake;
    MBEDTLS_SSL_DEBUG_MSG(2, ("Attempt to free buffered messages to have %u bytes available",
                              (unsigned) desired));

    /* Get rid of future records epoch first, if such exist. */
    ssl_free_buffered_record(ssl);

    /* Check if we have enough space available now. */
    if (desired <= (MBEDTLS_SSL_DTLS_MAX_BUFFERING -
                    hs->buffering.total_bytes_buffered)) {
        MBEDTLS_SSL_DEBUG_MSG(2, ("Enough space available after freeing future epoch record"));
        return 0;
    }

    /* We don't have enough space to buffer the next expected handshake
     * message. Remove buffers used for future messages to gain space,
     * starting with the most distant one. */
    for (offset = MBEDTLS_SSL_MAX_BUFFERED_HS - 1;
         offset >= 0; offset--) {
        MBEDTLS_SSL_DEBUG_MSG(2,
                              (
                                  "Free buffering slot %d to make space for reassembly of next handshake message",
                                  offset));

        ssl_buffering_free_slot(ssl, (uint8_t) offset);

        /* Check if we have enough space available now. */
        if (desired <= (MBEDTLS_SSL_DTLS_MAX_BUFFERING -
                        hs->buffering.total_bytes_buffered)) {
            MBEDTLS_SSL_DEBUG_MSG(2, ("Enough space available after freeing buffered HS messages"));
            return 0;
        }
    }

    return -1;
}